

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O3

void luaC_step(lua_State *L)

{
  global_State *pgVar1;
  uint uVar2;
  l_mem lVar3;
  lu_mem lVar4;
  ulong uVar5;
  
  pgVar1 = L->l_G;
  uVar2 = pgVar1->gcstepmul * 10;
  uVar5 = 0x7ffffffffffffffe;
  if (uVar2 != 0) {
    uVar5 = (ulong)uVar2;
  }
  pgVar1->gcdept = pgVar1->gcdept + (pgVar1->totalbytes - pgVar1->GCthreshold);
  do {
    lVar3 = singlestep(L);
    if (pgVar1->gcstate == '\0') break;
    uVar5 = uVar5 - lVar3;
  } while (0 < (long)uVar5);
  if (pgVar1->gcstate == '\0') {
    lVar4 = (long)pgVar1->gcpause * (pgVar1->estimate / 100);
  }
  else if (pgVar1->gcdept < 0x400) {
    lVar4 = pgVar1->totalbytes + 0x400;
  }
  else {
    pgVar1->gcdept = pgVar1->gcdept - 0x400;
    lVar4 = pgVar1->totalbytes;
  }
  pgVar1->GCthreshold = lVar4;
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  l_mem lim = (GCSTEPSIZE/100) * g->gcstepmul;
  if (lim == 0)
    lim = (MAX_LUMEM-1)/2;  /* no limit */
  g->gcdept += g->totalbytes - g->GCthreshold;
  do {
    lim -= singlestep(L);
    if (g->gcstate == GCSpause)
      break;
  } while (lim > 0);
  if (g->gcstate != GCSpause) {
    if (g->gcdept < GCSTEPSIZE)
      g->GCthreshold = g->totalbytes + GCSTEPSIZE;  /* - lim/g->gcstepmul;*/
    else {
      g->gcdept -= GCSTEPSIZE;
      g->GCthreshold = g->totalbytes;
    }
  }
  else {
    lua_assert(g->totalbytes >= g->estimate);
    setthreshold(g);
  }
}